

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status
hrgls_APICreateParametersGetCredentials
          (hrgls_APICreateParams params,uint8_t **returnCredentials,uint32_t *returnSize)

{
  hrgls_Status hVar1;
  
  if (params != (hrgls_APICreateParams)0x0) {
    hVar1 = 0x3e9;
    if (returnSize != (uint32_t *)0x0 && returnCredentials != (uint8_t **)0x0) {
      *returnCredentials =
           (params->credentials).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      *returnSize = *(int *)&(params->credentials).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(params->credentials).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
      hVar1 = 0;
    }
    return hVar1;
  }
  return 0x3ee;
}

Assistant:

hrgls_Status hrgls_APICreateParametersGetCredentials(hrgls_APICreateParams params,
    const uint8_t **returnCredentials, uint32_t *returnSize)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnCredentials) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    if (!returnSize) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    *returnCredentials = params->credentials.data();
    *returnSize = static_cast<uint32_t>(params->credentials.size());

    return s;
  }